

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

string * __thiscall minja::Value::to_str_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  value_t vVar1;
  bool bVar2;
  long __val;
  allocator<char> *__a;
  char *__s;
  double __val_00;
  allocator<char> local_12;
  allocator<char> local_11;
  
  vVar1 = (this->primitive_).m_data.m_type;
  if (vVar1 == string) {
    get<std::__cxx11::string>(__return_storage_ptr__,this);
  }
  else if ((byte)(vVar1 - number_integer) < 2) {
    __val = get<long>(this);
    std::__cxx11::to_string(__return_storage_ptr__,__val);
  }
  else {
    if (vVar1 == boolean) {
      bVar2 = get<bool>(this);
      __s = "False";
      if (bVar2) {
        __s = "True";
      }
      __a = &local_11;
    }
    else {
      if (vVar1 == number_float) {
        __val_00 = get<double>(this);
        std::__cxx11::to_string(__return_storage_ptr__,__val_00);
        return __return_storage_ptr__;
      }
      bVar2 = is_null(this);
      if (!bVar2) {
        dump_abi_cxx11_(__return_storage_ptr__,this,-1,false);
        return __return_storage_ptr__;
      }
      __s = "None";
      __a = &local_12;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_str() const {
    if (is_string()) return get<std::string>();
    if (is_number_integer()) return std::to_string(get<int64_t>());
    if (is_number_float()) return std::to_string(get<double>());
    if (is_boolean()) return get<bool>() ? "True" : "False";
    if (is_null()) return "None";
    return dump();
  }